

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

int __thiscall cmsys::RegExpFind::regmatch(RegExpFind *this,char *prog)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  bool bVar4;
  int min_no;
  char *save_3;
  int no_2;
  char nextch;
  char *save_2;
  char *save_1;
  int no_1;
  char *save;
  int no;
  char *opnd;
  size_t len;
  char *next;
  char *scan;
  char *prog_local;
  RegExpFind *this_local;
  
  next = prog;
  do {
    if (next == (char *)0x0) {
      printf("RegularExpression::find(): Internal error -- corrupted pointers.\n");
      return 0;
    }
    len = (size_t)regnext(next);
    switch(*next) {
    case '\0':
      return 1;
    case '\x01':
      if (this->reginput != this->regbol) {
        return 0;
      }
      break;
    case '\x02':
      if (*this->reginput != '\0') {
        return 0;
      }
      break;
    case '\x03':
      if (*this->reginput == '\0') {
        return 0;
      }
      this->reginput = this->reginput + 1;
      break;
    case '\x04':
      if ((*this->reginput == '\0') ||
         (pcVar3 = strchr(next + 3,(int)*this->reginput), pcVar3 == (char *)0x0)) {
        return 0;
      }
      this->reginput = this->reginput + 1;
      break;
    case '\x05':
      if ((*this->reginput == '\0') ||
         (pcVar3 = strchr(next + 3,(int)*this->reginput), pcVar3 != (char *)0x0)) {
        return 0;
      }
      this->reginput = this->reginput + 1;
      break;
    case '\x06':
      if (*(char *)len == '\x06') {
        do {
          pcVar3 = this->reginput;
          iVar2 = regmatch(this,next + 3);
          if (iVar2 != 0) {
            return 1;
          }
          this->reginput = pcVar3;
          next = regnext(next);
          bVar4 = false;
          if (next != (char *)0x0) {
            bVar4 = *next == '\x06';
          }
        } while (bVar4);
        return 0;
      }
      len = (size_t)(next + 3);
      break;
    case '\a':
      break;
    case '\b':
      pcVar3 = next + 3;
      if (*pcVar3 != *this->reginput) {
        return 0;
      }
      __n = strlen(pcVar3);
      if ((1 < __n) && (iVar2 = strncmp(pcVar3,this->reginput,__n), iVar2 != 0)) {
        return 0;
      }
      this->reginput = this->reginput + __n;
      break;
    case '\t':
      break;
    case '\n':
    case '\v':
      save_3._7_1_ = '\0';
      if (*(char *)len == '\b') {
        save_3._7_1_ = *(char *)(len + 3);
      }
      cVar1 = *next;
      pcVar3 = this->reginput;
      save_3._0_4_ = regrepeat(this,next + 3);
      while( true ) {
        if ((int)save_3 < (int)(uint)(cVar1 != '\n')) {
          return 0;
        }
        if (((save_3._7_1_ == '\0') || (*this->reginput == save_3._7_1_)) &&
           (iVar2 = regmatch(this,(char *)len), iVar2 != 0)) break;
        save_3._0_4_ = (int)save_3 + -1;
        this->reginput = pcVar3 + (int)save_3;
      }
      return 1;
    default:
      printf("RegularExpression::find(): Internal error -- memory corrupted.\n");
      return 0;
    case '\x15':
    case '\x16':
    case '\x17':
    case '\x18':
    case '\x19':
    case '\x1a':
    case '\x1b':
    case '\x1c':
    case '\x1d':
      cVar1 = *next;
      pcVar3 = this->reginput;
      iVar2 = regmatch(this,(char *)len);
      if (iVar2 != 0) {
        if (this->regstartp[cVar1 + -0x14] == (char *)0x0) {
          this->regstartp[cVar1 + -0x14] = pcVar3;
        }
        return 1;
      }
      return 0;
    case '\x1f':
    case ' ':
    case '!':
    case '\"':
    case '#':
    case '$':
    case '%':
    case '&':
    case '\'':
      cVar1 = *next;
      pcVar3 = this->reginput;
      iVar2 = regmatch(this,(char *)len);
      if (iVar2 != 0) {
        if (this->regendp[cVar1 + -0x1e] == (char *)0x0) {
          this->regendp[cVar1 + -0x1e] = pcVar3;
        }
        return 1;
      }
      return 0;
    }
    next = (char *)len;
  } while( true );
}

Assistant:

int RegExpFind::regmatch(const char* prog)
{
  const char* scan; // Current node.
  const char* next; // Next node.

  scan = prog;

  while (scan != nullptr) {

    next = regnext(scan);

    switch (OP(scan)) {
      case BOL:
        if (reginput != regbol)
          return (0);
        break;
      case EOL:
        if (*reginput != '\0')
          return (0);
        break;
      case ANY:
        if (*reginput == '\0')
          return (0);
        reginput++;
        break;
      case EXACTLY: {
        size_t len;
        const char* opnd;

        opnd = OPERAND(scan);
        // Inline the first character, for speed.
        if (*opnd != *reginput)
          return (0);
        len = strlen(opnd);
        if (len > 1 && strncmp(opnd, reginput, len) != 0)
          return (0);
        reginput += len;
      } break;
      case ANYOF:
        if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) == nullptr)
          return (0);
        reginput++;
        break;
      case ANYBUT:
        if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) != nullptr)
          return (0);
        reginput++;
        break;
      case NOTHING:
        break;
      case BACK:
        break;
      case OPEN + 1:
      case OPEN + 2:
      case OPEN + 3:
      case OPEN + 4:
      case OPEN + 5:
      case OPEN + 6:
      case OPEN + 7:
      case OPEN + 8:
      case OPEN + 9: {
        int no;
        const char* save;

        no = OP(scan) - OPEN;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set startp if some later invocation of the
          // same parentheses already has.
          //
          if (regstartp[no] == nullptr)
            regstartp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case CLOSE + 1:
      case CLOSE + 2:
      case CLOSE + 3:
      case CLOSE + 4:
      case CLOSE + 5:
      case CLOSE + 6:
      case CLOSE + 7:
      case CLOSE + 8:
      case CLOSE + 9: {
        int no;
        const char* save;

        no = OP(scan) - CLOSE;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set endp if some later invocation of the
          // same parentheses already has.
          //
          if (regendp[no] == nullptr)
            regendp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case BRANCH: {

        const char* save;

        if (OP(next) != BRANCH) // No choice.
          next = OPERAND(scan); // Avoid recursion.
        else {
          do {
            save = reginput;
            if (regmatch(OPERAND(scan)))
              return (1);
            reginput = save;
            scan = regnext(scan);
          } while (scan != nullptr && OP(scan) == BRANCH);
          return (0);
          // NOTREACHED
        }
      } break;
      case STAR:
      case PLUS: {
        char nextch;
        int no;
        const char* save;
        int min_no;

        //
        // Lookahead to avoid useless match attempts when we know
        // what character comes next.
        //
        nextch = '\0';
        if (OP(next) == EXACTLY)
          nextch = *OPERAND(next);
        min_no = (OP(scan) == STAR) ? 0 : 1;
        save = reginput;
        no = regrepeat(OPERAND(scan));
        while (no >= min_no) {
          // If it could work, try it.
          if (nextch == '\0' || *reginput == nextch)
            if (regmatch(next))
              return (1);
          // Couldn't or didn't -- back up.
          no--;
          reginput = save + no;
        }
        return (0);
      }
      //              break;
      case END:
        return (1); // Success!

      default:
        // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf(
          "RegularExpression::find(): Internal error -- memory corrupted.\n");
        return 0;
    }
    scan = next;
  }

  //
  //  We get here only if there's trouble -- normally "case END" is the
  //  terminating point.
  //
  // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
  printf("RegularExpression::find(): Internal error -- corrupted pointers.\n");
  return (0);
}